

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  int local_34;
  x86_reg local_30;
  int i;
  x86_reg reg2;
  x86_reg reg;
  char *mnem;
  void *info_local;
  SStream *OS_local;
  MCInst *MI_local;
  
  mnem = (char *)info;
  info_local = OS;
  OS_local = (SStream *)MI;
  if ((MI->csh->mode == CS_MODE_64) && (uVar3 = MCInst_getOpcode(MI), uVar3 == 0x163)) {
    SStream_concat0((SStream *)info_local,"callq\t");
    MCInst_setOpcodePub((MCInst *)OS_local,0x38);
    printPCRelImm((MCInst *)OS_local,0,(SStream *)info_local);
  }
  else {
    _reg2 = printAliasInstr((MCInst *)OS_local,(SStream *)info_local,mnem);
    if (_reg2 == (char *)0x0) {
      printInstruction((MCInst *)OS_local,(SStream *)info_local,(MCRegisterInfo *)mnem);
    }
    else {
      (*cs_mem_free)(_reg2);
    }
    if ((OS_local->buffer[5] & 1U) != 0) {
      if (*(byte *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x5c) < 2) {
        *(char *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x80) =
             OS_local[1].buffer[0x129];
      }
      else if ((**(int **)(OS_local[1].buffer + 0x10c) != 0x9c) &&
              (**(int **)(OS_local[1].buffer + 0x10c) != 0x9d)) {
        for (local_34 = 0;
            local_34 <
            (int)(uint)*(byte *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x5c);
            local_34 = local_34 + 1) {
          if (*(int *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60 +
                      (long)local_34 * 0x30) == 2) {
            *(undefined1 *)
             (*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + (long)local_34 * 0x30 + 0x80
             ) = *(undefined1 *)
                  (*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) +
                   (long)(int)(*(byte *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) +
                                        0x5c) - 1) * 0x30 + 0x80);
          }
        }
      }
    }
    if (*(int *)(*(long *)(OS_local[1].buffer + 0x11c) + 0x68) != 0) {
      uVar3 = MCInst_getOpcode((MCInst *)OS_local);
      switch(uVar3) {
      case 0x8f1:
      case 0x8f4:
      case 0x8f7:
      case 0x8fa:
      case 0x8fd:
      case 0x900:
      case 0x903:
      case 0x906:
      case 0x911:
      case 0x914:
      case 0x917:
      case 0x91a:
      case 0x91d:
      case 0x920:
      case 0x923:
      case 0x926:
      case 0x952:
      case 0x955:
      case 0x958:
      case 0x95b:
      case 0x95e:
      case 0x961:
      case 0x964:
      case 0x967:
      case 0x96a:
      case 0x96d:
      case 0x970:
      case 0x973:
      case 0x976:
      case 0x979:
      case 0x97c:
      case 0x97f:
      case 0x99a:
      case 0x99d:
      case 0x9a0:
      case 0x9a3:
      case 0x9a6:
      case 0x9a9:
      case 0x9ac:
      case 0x9af:
      case 0x9b3:
      case 0x9b6:
      case 0x9b9:
      case 0x9bc:
      case 0x9bf:
      case 0x9c2:
      case 0x9c5:
      case 0x9c8:
      case 0xa35:
      case 0xa38:
      case 0xa3b:
      case 0xa3e:
      case 0xa41:
      case 0xa44:
      case 0xa47:
      case 0xa4a:
      case 0xa5d:
      case 0xa60:
      case 0xa63:
      case 0xa66:
      case 0xa69:
      case 0xa6c:
      case 0xa6f:
      case 0xa72:
        memmove((void *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x90),
                (void *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60),0x150);
        *(undefined4 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60) = 2;
        *(undefined8 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x68) = 1;
        *(undefined1 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x80) = 1;
        lVar1 = *(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8);
        *(char *)(lVar1 + 0x5c) = *(char *)(lVar1 + 0x5c) + '\x01';
        break;
      default:
      }
      uVar3 = MCInst_getOpcode((MCInst *)OS_local);
      i = X86_insn_reg_att(uVar3);
      if (i == X86_REG_INVALID) {
        uVar3 = MCInst_getOpcode((MCInst *)OS_local);
        _Var2 = X86_insn_reg_att2(uVar3,(x86_reg *)&i,&local_30);
        if (_Var2) {
          *(undefined4 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60) = 1;
          *(int *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x68) = i;
          *(undefined1 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x80) =
               *(undefined1 *)
                (*(long *)(*(long *)(OS_local[1].buffer + 0x11c) + 0xa8) + (ulong)(uint)i);
          *(undefined4 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x90) = 1;
          *(x86_reg *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x98) = local_30;
          *(undefined1 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0xb0) =
               *(undefined1 *)
                (*(long *)(*(long *)(OS_local[1].buffer + 0x11c) + 0xa8) + (ulong)local_30);
          *(undefined1 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x5c) = 2;
        }
      }
      else {
        memmove((void *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x90),
                (void *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60),0x150);
        *(undefined4 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x60) = 1;
        *(int *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x68) = i;
        *(undefined1 *)(*(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8) + 0x80) =
             *(undefined1 *)
              (*(long *)(*(long *)(OS_local[1].buffer + 0x11c) + 0xa8) + (ulong)(uint)i);
        lVar1 = *(long *)(*(long *)(OS_local[1].buffer + 0x10c) + 0xe8);
        *(char *)(lVar1 + 0x5c) = *(char *)(lVar1 + 0x5c) + '\x01';
      }
    }
  }
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	int i;

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
				for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
					if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
						MI->flat_insn->detail->x86.operands[i].size =
							MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
				}
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
        // some instructions need to supply immediate 1 in the first op
        switch(MCInst_getOpcode(MI)) {
            default:
                break;
            case X86_SHL8r1:
            case X86_SHL16r1:
            case X86_SHL32r1:
            case X86_SHL64r1:
            case X86_SAL8r1:
            case X86_SAL16r1:
            case X86_SAL32r1:
            case X86_SAL64r1:
            case X86_SHR8r1:
            case X86_SHR16r1:
            case X86_SHR32r1:
            case X86_SHR64r1:
            case X86_SAR8r1:
            case X86_SAR16r1:
            case X86_SAR32r1:
            case X86_SAR64r1:
            case X86_RCL8r1:
            case X86_RCL16r1:
            case X86_RCL32r1:
            case X86_RCL64r1:
            case X86_RCR8r1:
            case X86_RCR16r1:
            case X86_RCR32r1:
            case X86_RCR64r1:
            case X86_ROL8r1:
            case X86_ROL16r1:
            case X86_ROL32r1:
            case X86_ROL64r1:
            case X86_ROR8r1:
            case X86_ROR16r1:
            case X86_ROR32r1:
            case X86_ROR64r1:
            case X86_SHL8m1:
            case X86_SHL16m1:
            case X86_SHL32m1:
            case X86_SHL64m1:
            case X86_SAL8m1:
            case X86_SAL16m1:
            case X86_SAL32m1:
            case X86_SAL64m1:
            case X86_SHR8m1:
            case X86_SHR16m1:
            case X86_SHR32m1:
            case X86_SHR64m1:
            case X86_SAR8m1:
            case X86_SAR16m1:
            case X86_SAR32m1:
            case X86_SAR64m1:
            case X86_RCL8m1:
            case X86_RCL16m1:
            case X86_RCL32m1:
            case X86_RCL64m1:
            case X86_RCR8m1:
            case X86_RCR16m1:
            case X86_RCR32m1:
            case X86_RCR64m1:
            case X86_ROL8m1:
            case X86_ROL16m1:
            case X86_ROL32m1:
            case X86_ROL64m1:
            case X86_ROR8m1:
            case X86_ROR16m1:
            case X86_ROR32m1:
            case X86_ROR64m1:
                // shift all the ops right to leave 1st slot for this new register op
                memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
                        sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
                MI->flat_insn->detail->x86.operands[0].type = X86_OP_IMM;
                MI->flat_insn->detail->x86.operands[0].imm = 1;
                MI->flat_insn->detail->x86.operands[0].size = 1;
                MI->flat_insn->detail->x86.op_count++;
        }

		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		reg = X86_insn_reg_att(MCInst_getOpcode(MI));
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}
}